

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline_executor.cpp
# Opt level: O0

void __thiscall
duckdb::PipelineExecutor::FinishProcessing(PipelineExecutor *this,int32_t operator_idx)

{
  bool bVar1;
  optional_ptr<duckdb::PhysicalOperator,_true> guard_00;
  PhysicalOperator *this_00;
  int in_ESI;
  undefined8 *in_RDI;
  unique_lock<std::mutex> guard_1;
  unique_lock<std::mutex> guard;
  StateWithBlockableTasks *in_stack_fffffffffffffef8;
  StateWithBlockableTasks *in_stack_ffffffffffffff00;
  unique_lock<std::mutex> *in_stack_ffffffffffffff20;
  pointer in_stack_ffffffffffffff28;
  int local_c4;
  PhysicalOperator *local_90 [5];
  PhysicalOperator *local_68 [13];
  
  local_c4 = in_ESI;
  if (in_ESI < 0) {
    local_c4 = NumericLimits<int>::Maximum();
  }
  *(int *)((long)in_RDI + 0x1c4) = local_c4;
  ::std::stack<unsigned_long,std::deque<unsigned_long,std::allocator<unsigned_long>>>::
  stack<std::deque<unsigned_long,std::allocator<unsigned_long>>,void>
            ((stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> *)
             in_stack_ffffffffffffff00);
  ::std::stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::operator=
            ((stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> *)
             in_stack_ffffffffffffff00,
             (stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> *)
             in_stack_fffffffffffffef8);
  ::std::stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::~stack
            ((stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> *)
             0x998c25);
  local_68[0] = (PhysicalOperator *)Pipeline::GetSource((Pipeline *)*in_RDI);
  bVar1 = duckdb::optional_ptr::operator_cast_to_bool((optional_ptr *)local_68);
  if (bVar1) {
    unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>,_true>::
    operator->((unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>,_true>
                *)in_stack_ffffffffffffff00);
    StateWithBlockableTasks::Lock(in_stack_fffffffffffffef8);
    unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>,_true>::
    operator->((unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>,_true>
                *)in_stack_ffffffffffffff00);
    StateWithBlockableTasks::PreventBlocking
              (in_stack_ffffffffffffff00,(unique_lock<std::mutex> *)in_stack_fffffffffffffef8);
    in_stack_ffffffffffffff28 =
         unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>,_true>
         ::operator->((unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>,_true>
                       *)in_stack_ffffffffffffff00);
    StateWithBlockableTasks::UnblockTasks
              ((StateWithBlockableTasks *)in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    ::std::unique_lock<std::mutex>::~unique_lock
              ((unique_lock<std::mutex> *)in_stack_ffffffffffffff00);
  }
  local_90[0] = (PhysicalOperator *)Pipeline::GetSink((Pipeline *)*in_RDI);
  bVar1 = duckdb::optional_ptr::operator_cast_to_bool((optional_ptr *)local_90);
  if (bVar1) {
    Pipeline::GetSink((Pipeline *)*in_RDI);
    optional_ptr<duckdb::PhysicalOperator,_true>::operator->
              ((optional_ptr<duckdb::PhysicalOperator,_true> *)in_stack_ffffffffffffff00);
    unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>::
    operator->((unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>
                *)in_stack_ffffffffffffff00);
    StateWithBlockableTasks::Lock(in_stack_fffffffffffffef8);
    guard_00 = Pipeline::GetSink((Pipeline *)*in_RDI);
    optional_ptr<duckdb::PhysicalOperator,_true>::operator->
              ((optional_ptr<duckdb::PhysicalOperator,_true> *)in_stack_ffffffffffffff00);
    unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>::
    operator->((unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>
                *)in_stack_ffffffffffffff00);
    StateWithBlockableTasks::PreventBlocking
              (in_stack_ffffffffffffff00,(unique_lock<std::mutex> *)in_stack_fffffffffffffef8);
    Pipeline::GetSink((Pipeline *)*in_RDI);
    this_00 = optional_ptr<duckdb::PhysicalOperator,_true>::operator->
                        ((optional_ptr<duckdb::PhysicalOperator,_true> *)in_stack_ffffffffffffff00);
    unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>::
    operator->((unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>
                *)this_00);
    StateWithBlockableTasks::UnblockTasks
              ((StateWithBlockableTasks *)in_stack_ffffffffffffff28,
               (unique_lock<std::mutex> *)guard_00.ptr);
    ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)this_00);
  }
  return;
}

Assistant:

void PipelineExecutor::FinishProcessing(int32_t operator_idx) {
	finished_processing_idx = operator_idx < 0 ? NumericLimits<int32_t>::Maximum() : operator_idx;
	in_process_operators = stack<idx_t>();

	if (pipeline.GetSource()) {
		auto guard = pipeline.source_state->Lock();
		pipeline.source_state->PreventBlocking(guard);
		pipeline.source_state->UnblockTasks(guard);
	}
	if (pipeline.GetSink()) {
		auto guard = pipeline.GetSink()->sink_state->Lock();
		pipeline.GetSink()->sink_state->PreventBlocking(guard);
		pipeline.GetSink()->sink_state->UnblockTasks(guard);
	}
}